

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

bool llvm::sys::path::has_stem(Twine *path,Style style)

{
  uint *puVar1;
  Style in_ECX;
  StringRef SVar2;
  StringRef SVar3;
  undefined1 local_a8 [8];
  SmallString<128U> path_storage;
  
  puVar1 = &path_storage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Size;
  path_storage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x8000000000;
  local_a8 = (undefined1  [8])puVar1;
  SVar2 = Twine::toStringRef(path,(SmallVectorImpl<char> *)local_a8);
  SVar3.Length._0_4_ = style;
  SVar3.Data = (char *)SVar2.Length;
  SVar3.Length._4_4_ = 0;
  SVar3 = stem((path *)SVar2.Data,SVar3,in_ECX);
  if (local_a8 != (undefined1  [8])puVar1) {
    free((void *)local_a8);
  }
  return SVar3.Length != 0;
}

Assistant:

bool has_stem(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !stem(p, style).empty();
}